

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

void __thiscall
LZ77Compressor::compress<LZ77Compressor::DefaultEncode&>
          (LZ77Compressor *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
          uint8_t *input,int inputLength,DefaultEncode *encode)

{
  LZ77Compressor *this_00;
  size_type sVar1;
  ulong uVar2;
  DefaultEncode *in_RSI;
  LZ77Compressor *in_RDI;
  int i;
  vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> *vec;
  DefaultEncode *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  int len;
  int iVar3;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10c810);
  this_00 = (LZ77Compressor *)
            compress(in_RDI,(uint8_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                     ,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  len = 0;
  while( true ) {
    iVar3 = len;
    sVar1 = std::vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>::size
                      ((vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> *)
                       this_00);
    if ((int)sVar1 + -7 <= len) break;
    in_stack_ffffffffffffffb0 = in_RSI;
    std::vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>::operator[]
              ((vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> *)this_00,
               (long)iVar3);
    compress_helper<LZ77Compressor::DefaultEncode>
              (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT44(iVar3,in_stack_ffffffffffffffc8),(Item *)in_RDI,len,
               in_stack_ffffffffffffffb0);
    len = iVar3 + 8;
  }
  uVar2 = (ulong)iVar3;
  sVar1 = std::vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>::size
                    ((vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> *)this_00)
  ;
  if (uVar2 < sVar1) {
    std::vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>::operator[]
              ((vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> *)this_00,
               (long)iVar3);
    std::vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>::size
              ((vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> *)this_00);
    compress_helper<LZ77Compressor::DefaultEncode>
              (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT44(iVar3,in_stack_ffffffffffffffc8),(Item *)in_RDI,len,
               in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void compress(std::vector<uint8_t>& out, const uint8_t* input, int inputLength, Fn&& encode) {
		out.clear();
		const auto& vec = compress(input, inputLength);
		int i = 0;
		for (; i < static_cast<int>(vec.size()) - 7; i += 8) {
			compress_helper(out, &vec[i], 8, encode);
		}
		if (i < vec.size()) {
			compress_helper(out, &vec[i], vec.size() - i, encode);
		}
	}